

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O0

void cppcms::impl::details::decimal_traits<true>::conv<long_long>
               (longlong v,char **begin,char **buf)

{
  char *pcVar1;
  char **in_RDX;
  char **in_RSI;
  long in_RDI;
  long local_8;
  
  if (in_RDI < 0) {
    pcVar1 = *in_RDX;
    *in_RDX = pcVar1 + 1;
    *pcVar1 = '-';
    *in_RSI = *in_RDX;
    for (local_8 = in_RDI; local_8 != 0; local_8 = local_8 / 10) {
      pcVar1 = *in_RDX;
      *in_RDX = pcVar1 + 1;
      *pcVar1 = '0' - (char)(local_8 % 10);
    }
  }
  else {
    decimal_traits<false>::conv<long_long>(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}